

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_Maps_Test::TestBody
          (ParseMessageTest_Maps_Test *this)

{
  ParseMessageTest_Maps_Test *this_local;
  
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "message TestMessage {\n  map<int32, string> primitive_type_map = 1;\n  map<KeyType, ValueType> composite_type_map = 2;\n}\n"
             ,
             "message_type {  name: \"TestMessage\"  nested_type {    name: \"PrimitiveTypeMapEntry\"    field {        name: \"key\" number: 1 label:LABEL_OPTIONAL       type:TYPE_INT32    }    field {        name: \"value\" number: 2 label:LABEL_OPTIONAL       type:TYPE_STRING    }    options { map_entry: true }  }  nested_type {    name: \"CompositeTypeMapEntry\"    field {        name: \"key\" number: 1 label:LABEL_OPTIONAL       type_name: \"KeyType\"    }    field {        name: \"value\" number: 2 label:LABEL_OPTIONAL       type_name: \"ValueType\"    }    options { map_entry: true }  }  field {    name: \"primitive_type_map\"    label: LABEL_REPEATED    type_name: \"PrimitiveTypeMapEntry\"    number: 1  }  field {    name: \"composite_type_map\"    label: LABEL_REPEATED    type_name: \"CompositeTypeMapEntry\"    number: 2  }}"
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, Maps) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  map<int32, string> primitive_type_map = 1;\n"
      "  map<KeyType, ValueType> composite_type_map = 2;\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  nested_type {"
      "    name: \"PrimitiveTypeMapEntry\""
      "    field { "
      "       name: \"key\" number: 1 label:LABEL_OPTIONAL"
      "       type:TYPE_INT32"
      "    }"
      "    field { "
      "       name: \"value\" number: 2 label:LABEL_OPTIONAL"
      "       type:TYPE_STRING"
      "    }"
      "    options { map_entry: true }"
      "  }"
      "  nested_type {"
      "    name: \"CompositeTypeMapEntry\""
      "    field { "
      "       name: \"key\" number: 1 label:LABEL_OPTIONAL"
      "       type_name: \"KeyType\""
      "    }"
      "    field { "
      "       name: \"value\" number: 2 label:LABEL_OPTIONAL"
      "       type_name: \"ValueType\""
      "    }"
      "    options { map_entry: true }"
      "  }"
      "  field {"
      "    name: \"primitive_type_map\""
      "    label: LABEL_REPEATED"
      "    type_name: \"PrimitiveTypeMapEntry\""
      "    number: 1"
      "  }"
      "  field {"
      "    name: \"composite_type_map\""
      "    label: LABEL_REPEATED"
      "    type_name: \"CompositeTypeMapEntry\""
      "    number: 2"
      "  }"
      "}");
}